

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputeOriginalValues
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CorrType *in_corr,int *out_data,int param_3,int num_components,
          PointIndex *entry_to_point_id_map)

{
  Transform *this_00;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *pvVar1;
  bool bVar2;
  pointer __p;
  pointer __p_00;
  const_reference pvVar3;
  int *out_original_vals;
  ulong uVar4;
  ulong uVar5;
  size_type __n;
  ulong uVar6;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_38;
  
  uVar6 = 0;
  if (num_components == 2) {
    this->num_components_ = 2;
    this->entry_to_point_id_map_ = entry_to_point_id_map;
    __p_00 = (pointer)operator_new__(8);
    local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)
         (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)0x0;
    std::__uniq_ptr_impl<int,_std::default_delete<int[]>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int[]>_> *)&this->predicted_value_,__p_00);
    std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)&local_38);
    this_00 = &(this->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
               ).
               super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               .transform_;
    PredictionSchemeWrapTransformBase<int>::Init
              (&this_00->super_PredictionSchemeWrapTransformBase<int>,2);
    pvVar1 = (this->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ).mesh_data_.data_to_corner_map_;
    uVar4 = (ulong)((long)(pvVar1->
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar1->
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 2;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    out_original_vals = out_data;
    for (__n = 0; uVar6 = (ulong)(uVar5 == __n), uVar5 != __n; __n = __n + 1) {
      pvVar3 = std::
               vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ::at((this->
                    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                    ).mesh_data_.data_to_corner_map_,__n);
      bVar2 = ComputePredictedValue(this,(CornerIndex)pvVar3->value_,out_data,(int)__n);
      if (!bVar2) break;
      PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
                (this_00,(this->predicted_value_)._M_t.
                         super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                         super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl,in_corr,out_original_vals)
      ;
      out_original_vals = out_original_vals + 2;
      in_corr = in_corr + 2;
    }
  }
  return SUB81(uVar6,0);
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputeOriginalValues(const CorrType *in_corr, DataTypeT *out_data,
                          int /* size */, int num_components,
                          const PointIndex *entry_to_point_id_map) {
  if (num_components != 2) {
    // Corrupt/malformed input. Two output components are req'd.
    return false;
  }
  num_components_ = num_components;
  entry_to_point_id_map_ = entry_to_point_id_map;
  predicted_value_ =
      std::unique_ptr<DataTypeT[]>(new DataTypeT[num_components]);
  this->transform().Init(num_components);

  const int corner_map_size =
      static_cast<int>(this->mesh_data().data_to_corner_map()->size());
  for (int p = 0; p < corner_map_size; ++p) {
    const CornerIndex corner_id = this->mesh_data().data_to_corner_map()->at(p);
    if (!ComputePredictedValue(corner_id, out_data, p)) {
      return false;
    }

    const int dst_offset = p * num_components;
    this->transform().ComputeOriginalValue(
        predicted_value_.get(), in_corr + dst_offset, out_data + dst_offset);
  }
  return true;
}